

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O0

MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_> *
__thiscall
deqp::egl::Image::CreateImageGLES2::getImageSource
          (MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
           *__return_storage_ptr__,CreateImageGLES2 *this,EGLint target,GLenum internalFormat,
          GLenum format,GLenum type,bool useTexLevel0)

{
  bool useTexLevel0_local;
  GLenum type_local;
  GLenum format_local;
  GLenum internalFormat_local;
  EGLint target_local;
  CreateImageGLES2 *this_local;
  
  if ((target == 0x30b1) || (target - 0x30b3U < 6)) {
    createTextureImageSource(__return_storage_ptr__,target,internalFormat,format,type,useTexLevel0);
  }
  else if (target == 0x30b9) {
    createRenderbufferImageSource(__return_storage_ptr__,internalFormat);
  }
  else if (target == 0x3140) {
    createAndroidNativeImageSource(__return_storage_ptr__,internalFormat);
  }
  else {
    de::details::
    MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>::
    MovePtr(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MovePtr<ImageSource> getImageSource (EGLint target, GLenum internalFormat, GLenum format, GLenum type, bool useTexLevel0)
	{
		switch (target)
		{
			case EGL_GL_TEXTURE_2D_KHR:
			case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_X_KHR:
			case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_X_KHR:
			case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Y_KHR:
			case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Y_KHR:
			case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Z_KHR:
			case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Z_KHR:
				DE_ASSERT(format != 0u && type != 0u);
				return createTextureImageSource(target, internalFormat, format, type, useTexLevel0);

			case EGL_GL_RENDERBUFFER_KHR:
				DE_ASSERT(format == 0u && type == 0u);
				return createRenderbufferImageSource(internalFormat);

			case EGL_NATIVE_BUFFER_ANDROID:
				DE_ASSERT(format == 0u && type == 0u);
				return createAndroidNativeImageSource(internalFormat);

			default:
				DE_FATAL("Impossible");
				return MovePtr<ImageSource>();
		}
	}